

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

result<int,_toml::detail::none_t> __thiscall
toml::detail::from_string<int>(detail *this,string *str)

{
  detail dVar1;
  int v;
  istringstream iss;
  byte abStack_170 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  std::istream::operator>>((istream *)&iss,&v);
  dVar1 = (detail)((abStack_170[*(long *)(_iss + -0x18)] & 5) == 0);
  if ((bool)dVar1) {
    *(int *)(this + 4) = v;
  }
  *this = dVar1;
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return (result<int,_toml::detail::none_t>)this;
}

Assistant:

result<T, none_t> from_string(const std::string& str)
{
    T v;
    std::istringstream iss(str);
    iss >> v;
    if(iss.fail())
    {
        return err();
    }
    return ok(v);
}